

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O0

void logprintf(string *program_name,string *msgtype,char *format,...)

{
  char in_AL;
  __pid_t _Var1;
  char *__filename;
  FILE *__stream;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2b8 [24];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  undefined4 local_208;
  undefined4 local_204;
  va_list args;
  FILE *fout;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  __cxx11 local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [8];
  string b2;
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [55];
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string base;
  char *format_local;
  string *msgtype_local;
  string *program_name_local;
  
  if (in_AL != '\0') {
    local_288 = in_XMM0_Qa;
    local_278 = in_XMM1_Qa;
    local_268 = in_XMM2_Qa;
    local_258 = in_XMM3_Qa;
    local_248 = in_XMM4_Qa;
    local_238 = in_XMM5_Qa;
    local_228 = in_XMM6_Qa;
    local_218 = in_XMM7_Qa;
  }
  local_2a0 = in_RCX;
  local_298 = in_R8;
  local_290 = in_R9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"/\\",&local_61);
  base_name<std::__cxx11::string>(local_40,program_name);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"/\\",&local_d9);
  base_name<std::__cxx11::string>(local_b8,local_40);
  remove_extension<std::__cxx11::string>(local_98);
  std::__cxx11::string::operator=((string *)local_40,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::operator+(local_120,(char *)local_40);
  _Var1 = getpid();
  std::__cxx11::to_string(local_140,_Var1);
  std::operator+(local_100,local_120);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_120);
  std::operator+((char *)local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"log/");
  std::operator+(local_1a0,(char *)local_1c0);
  _Var1 = getpid();
  std::__cxx11::to_string((__cxx11 *)&fout,_Var1);
  std::operator+(local_180,local_1a0);
  std::operator+(local_160,(char *)local_180);
  std::__cxx11::string::operator=((string *)local_40,(string *)local_160);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string(local_1c0);
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"a");
  if (__stream != (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s:%s:",uVar2,uVar3);
    args[0].overflow_arg_area = local_2b8;
    args[0]._0_8_ = &stack0x00000008;
    local_204 = 0x30;
    local_208 = 0x18;
    vfprintf(__stream,format,&local_208);
    fclose(__stream);
  }
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

inline  void logprintf(const std::string &program_name,const std::string &msgtype,const char* format, ...)
{
	
	std::string base = base_name(program_name);
	base = remove_extension(base_name(base));
	std::string b2 = base + ":" + std::to_string(GETPID());
	base = "log/" + base + "_" + std::to_string(GETPID()) + ".log";

	FILE* fout = fopen(base.c_str(), "a");
	if (fout != nullptr) {
		fprintf(fout, "%s:%s:",msgtype.c_str(),b2.c_str());
		va_list args;
		va_start(args, format);
		vfprintf(fout, format, args);
		va_end(args);
		fclose(fout);
	}
	
}